

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogoutView.cpp
# Opt level: O2

void __thiscall LogoutView::display(LogoutView *this)

{
  Application *this_00;
  Controller *this_01;
  View *pVVar1;
  allocator local_31;
  string local_30;
  
  this_00 = Application::getInstance();
  Application::logout(this_00);
  std::operator<<((ostream *)&std::cout,"Logged out successfully.\n");
  this_01 = Controller::getInstance();
  std::__cxx11::string::string((string *)&local_30,"splash",&local_31);
  pVVar1 = Controller::getView(this_01,&local_30);
  View::response->view = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void LogoutView::display() {
    Application::getInstance().logout();
    cout << "Logged out successfully.\n";
    // Application::saveData();
    response->view = Controller::getInstance().getView("splash");
}